

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * __thiscall
testing::internal::WideStringToUtf8_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,wchar_t *str,int num_chars)

{
  size_t sVar1;
  uint uVar2;
  UInt32 extraout_EDX;
  UInt32 code_point;
  UInt32 extraout_EDX_00;
  ulong uVar3;
  ulong uVar4;
  stringstream stream;
  string sStack_1d8;
  stringstream local_1b8 [16];
  ostream local_1a8 [376];
  
  uVar2 = (uint)str;
  if (uVar2 == 0xffffffff) {
    sVar1 = wcslen((wchar_t *)this);
    uVar2 = (uint)sVar1;
  }
  std::__cxx11::stringstream::stringstream(local_1b8);
  uVar3 = 0;
  code_point = extraout_EDX;
  uVar4 = (ulong)uVar2;
  if ((int)uVar2 < 1) {
    uVar4 = uVar3;
  }
  for (; (uVar4 != uVar3 && (*(uint *)(this + uVar3 * 4) != 0)); uVar3 = uVar3 + 1) {
    CodePointToUtf8_abi_cxx11_
              (&sStack_1d8,(internal *)(ulong)*(uint *)(this + uVar3 * 4),code_point);
    std::operator<<(local_1a8,(string *)&sStack_1d8);
    std::__cxx11::string::~string((string *)&sStack_1d8);
    code_point = extraout_EDX_00;
  }
  StringStreamToString(__return_storage_ptr__,(stringstream *)local_1b8);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  return __return_storage_ptr__;
}

Assistant:

std::string WideStringToUtf8(const wchar_t* str, int num_chars) {
  if (num_chars == -1)
    num_chars = static_cast<int>(wcslen(str));

  ::std::stringstream stream;
  for (int i = 0; i < num_chars; ++i) {
    UInt32 unicode_code_point;

    if (str[i] == L'\0') {
      break;
    } else if (i + 1 < num_chars && IsUtf16SurrogatePair(str[i], str[i + 1])) {
      unicode_code_point = CreateCodePointFromUtf16SurrogatePair(str[i],
                                                                 str[i + 1]);
      i++;
    } else {
      unicode_code_point = static_cast<UInt32>(str[i]);
    }

    stream << CodePointToUtf8(unicode_code_point);
  }
  return StringStreamToString(&stream);
}